

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O1

int scaling_list_data(HEVCContext *s,ScalingList *sl,HEVCSPS *sps)

{
  byte bVar1;
  RK_U8 RVar2;
  undefined2 uVar3;
  BitReadCtx_t *pBVar4;
  BitReadCtx_t *pBVar5;
  MPP_RET MVar6;
  RK_U8 *pRVar7;
  long lVar8;
  uint uVar9;
  ulong in_RCX;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint unaff_R14D;
  int iVar14;
  RK_S32 _out;
  RK_S32 scaling_list_dc_coef [2] [6];
  uint local_cc;
  uint local_c8;
  int local_c4;
  BitReadCtx_t *local_c0;
  long local_b8;
  int local_ac;
  RK_U8 (*local_a8) [6];
  ScalingList *local_a0;
  ulong local_98;
  HEVCSPS *local_90;
  size_t local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  uint auStack_68 [14];
  
  local_c0 = &s->HEVClc->gb;
  local_a8 = sl->sl_dc;
  uVar13 = 0;
  local_a0 = sl;
  local_98 = in_RCX;
  local_90 = sps;
  do {
    uVar11 = 0x10 << ((char)uVar13 * '\x02' & 0x1fU);
    if (0x3f < uVar11) {
      uVar11 = 0x40;
    }
    local_88 = 0x40;
    if (uVar13 == 0) {
      local_88 = 0x10;
    }
    local_b8 = uVar13 - 2;
    local_78 = (ulong)(uVar11 + (uVar11 == 0));
    local_ac = (uint)(uVar13 == 3) * 2 + 1;
    local_80 = (ulong)((uint)(uVar13 == 3) * 2) + 1;
    uVar12 = 0;
    local_70 = uVar13;
    uVar11 = unaff_R14D;
    do {
      pBVar4 = local_c0;
      MVar6 = mpp_read_bits(local_c0,1,(RK_S32 *)&local_cc);
      pBVar5 = local_c0;
      pBVar4->ret = MVar6;
      unaff_R14D = local_cc;
      if (MVar6 != MPP_OK) {
        unaff_R14D = uVar11 & 0xff;
      }
      local_c4 = -0x3ec;
      if (MVar6 != MPP_OK) {
        return -0x3ec;
      }
      if ((char)unaff_R14D == '\0') {
        MVar6 = mpp_read_ue(local_c0,&local_cc);
        pBVar5->ret = MVar6;
        if (MVar6 != MPP_OK) {
          return local_c4;
        }
        if (local_cc != 0) {
          if (uVar12 < local_cc * local_ac) {
            _mpp_log_l(2,"H265PARSER_PS","Invalid delta in scaling list data: %d.\n",(char *)0x0);
            return local_c4;
          }
          uVar11 = (int)uVar12 - local_cc * local_ac;
          memcpy(sl->sl[uVar13] + uVar12,sl->sl[uVar13] + uVar11,local_88);
          if (1 < uVar13) {
            local_a8[local_b8][uVar12] = local_a8[local_b8][uVar11];
          }
        }
      }
      else {
        uVar11 = 8;
        if (uVar13 < 2) {
LAB_001a389b:
          uVar10 = 0;
          local_c8 = unaff_R14D;
          do {
            pBVar4 = local_c0;
            if (uVar13 == 0) {
              iVar14 = (uint)""[uVar10] << 2;
              pRVar7 = "";
            }
            else {
              iVar14 = (uint)""[uVar10] << 3;
              pRVar7 = "";
            }
            bVar1 = pRVar7[uVar10];
            MVar6 = mpp_read_se(local_c0,(RK_S32 *)&local_cc);
            pBVar4->ret = MVar6;
            uVar13 = local_70;
            sl = local_a0;
            unaff_R14D = local_c8;
            if (MVar6 != MPP_OK) {
              iVar14 = 10;
              goto LAB_001a3a0d;
            }
            local_98 = (ulong)local_cc;
            uVar9 = local_cc + uVar11 + 0x100;
            uVar11 = local_cc + uVar11 + 0x1ff;
            if (-1 < (int)uVar9) {
              uVar11 = uVar9;
            }
            uVar11 = uVar9 - (uVar11 & 0xffffff00);
            local_a0->sl[local_70][uVar12][iVar14 + (uint)bVar1] = (RK_U8)uVar11;
            uVar10 = uVar10 + 1;
          } while (local_78 != uVar10);
          iVar14 = 0;
        }
        else {
          MVar6 = mpp_read_se(local_c0,(RK_S32 *)&local_cc);
          pBVar5->ret = MVar6;
          iVar14 = 10;
          if (MVar6 == MPP_OK) {
            auStack_68[local_b8 * 6 + uVar12] = local_cc;
            uVar11 = auStack_68[local_b8 * 6 + uVar12] + 8;
            auStack_68[local_b8 * 6 + uVar12] = uVar11;
            local_a8[local_b8][uVar12] = (RK_U8)uVar11;
            goto LAB_001a389b;
          }
        }
LAB_001a3a0d:
        if (iVar14 != 0) {
          return local_c4;
        }
      }
      uVar12 = uVar12 + local_80;
      uVar11 = unaff_R14D;
    } while (uVar12 < 6);
    uVar13 = uVar13 + 1;
    if (uVar13 == 4) {
      if (local_90->chroma_format_idc == 3) {
        lVar8 = -0x40;
        do {
          RVar2 = sl->sl[2][3][lVar8];
          sl->sl[3][2][lVar8] = sl->sl[2][2][lVar8];
          sl->sl[3][3][lVar8] = RVar2;
          *(RK_U8 *)((long)(sl->sl_dc + -0xb) + lVar8 + 2) = sl->sl[2][5][lVar8];
          sl->sl_dc[0][lVar8] = sl->sl[3][0][lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
        uVar3 = *(undefined2 *)(sl->sl_dc[0] + 4);
        *(undefined2 *)(sl->sl_dc[1] + 1) = *(undefined2 *)(sl->sl_dc[0] + 1);
        *(undefined2 *)(sl->sl_dc[1] + 4) = uVar3;
      }
      return 0;
    }
  } while( true );
}

Assistant:

static int scaling_list_data(HEVCContext *s, ScalingList *sl, HEVCSPS *sps)
{
    BitReadCtx_t *gb = &s->HEVClc->gb;
    RK_U8 scaling_list_pred_mode_flag;
    RK_S32 scaling_list_dc_coef[2][6];
    RK_S32 size_id,  i, pos;
    RK_U32 matrix_id;

    for (size_id = 0; size_id < 4; size_id++)
        for (matrix_id = 0; matrix_id < 6; matrix_id += ((size_id == 3) ? 3 : 1)) {
            READ_ONEBIT(gb, &scaling_list_pred_mode_flag);
            if (!scaling_list_pred_mode_flag) {
                RK_U32 delta = 0;
                READ_UE(gb, &delta);
                /* Only need to handle non-zero delta. Zero means default,
                 * which should already be in the arrays. */
                if (delta) {
                    // Copy from previous array.
                    delta *= (size_id == 3) ? 3 : 1;
                    if (matrix_id < delta) {
                        mpp_err(
                            "Invalid delta in scaling list data: %d.\n", delta);
                        return  MPP_ERR_STREAM;
                    }

                    memcpy(sl->sl[size_id][matrix_id],
                           sl->sl[size_id][matrix_id - delta],
                           size_id > 0 ? 64 : 16);
                    if (size_id > 1)
                        sl->sl_dc[size_id - 2][matrix_id] = sl->sl_dc[size_id - 2][matrix_id - delta];
                }
            } else {
                RK_S32 next_coef, coef_num;
                RK_S32 scaling_list_delta_coef;

                next_coef = 8;
                coef_num  = MPP_MIN(64, 1 << (4 + (size_id << 1)));
                if (size_id > 1) {
                    READ_SE(gb, &scaling_list_dc_coef[size_id - 2][matrix_id]);
                    scaling_list_dc_coef[size_id - 2][matrix_id] =  scaling_list_dc_coef[size_id - 2][matrix_id] + 8;
                    next_coef = scaling_list_dc_coef[size_id - 2][matrix_id];
                    sl->sl_dc[size_id - 2][matrix_id] = next_coef;
                }
                for (i = 0; i < coef_num; i++) {
                    if (size_id == 0)
                        pos = 4 * mpp_hevc_diag_scan4x4_y[i] +
                              mpp_hevc_diag_scan4x4_x[i];
                    else
                        pos = 8 * mpp_hevc_diag_scan8x8_y[i] +
                              mpp_hevc_diag_scan8x8_x[i];

                    READ_SE(gb, &scaling_list_delta_coef);
                    next_coef = (next_coef + scaling_list_delta_coef + 256) % 256;
                    sl->sl[size_id][matrix_id][pos] = next_coef;
                }
            }
        }
    if (sps->chroma_format_idc == H265_CHROMA_444) {
        for (i = 0; i < 64; i++) {
            sl->sl[3][1][i] = sl->sl[2][1][i];
            sl->sl[3][2][i] = sl->sl[2][2][i];
            sl->sl[3][4][i] = sl->sl[2][4][i];
            sl->sl[3][5][i] = sl->sl[2][5][i];
        }
        sl->sl_dc[1][1] = sl->sl_dc[0][1];
        sl->sl_dc[1][2] = sl->sl_dc[0][2];
        sl->sl_dc[1][4] = sl->sl_dc[0][4];
        sl->sl_dc[1][5] = sl->sl_dc[0][5];
    }
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}